

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O1

void __thiscall
chrono::collision::cbtCylshellBoxCollisionAlgorithm::processCollision
          (cbtCylshellBoxCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0,
          cbtCollisionObjectWrapper *body1,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  cbtScalar cVar1;
  float fVar2;
  cbtCollisionShape *pcVar3;
  cbtTransform *pcVar4;
  cbtCollisionShape *pcVar5;
  cbtPersistentManifold *this_00;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  cbtManifoldResult *pcVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  cbtCollisionObjectWrapper *pcVar18;
  cbtCollisionObject *pcVar19;
  cbtCollisionObject *pcVar20;
  ulong uVar21;
  long lVar22;
  float fVar23;
  float fVar24;
  cbtScalar cVar25;
  undefined8 uVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  cbtScalar tMax;
  cbtScalar tMin;
  cbtVector3 cs;
  cbtVector3 a;
  cbtVector3 pMid;
  cbtVector3 pMax;
  cbtVector3 pMin;
  cbtVector3 hdims;
  float local_118;
  float local_114;
  ulong local_110;
  float local_108;
  undefined4 uStack_104;
  undefined8 uStack_100;
  cbtVector3 local_f8;
  cbtVector3 local_e8;
  float local_d8;
  undefined4 uStack_d4;
  undefined8 uStack_d0;
  cbtManifoldResult *local_c0;
  cbtVector3 local_b8;
  ulong local_a8;
  ulong local_a0;
  cbtCylshellBoxCollisionAlgorithm *local_98;
  cbtTransform *local_90;
  cbtVector3 local_88;
  cbtVector3 local_78;
  ulong local_68;
  cbtVector3 local_60;
  cbtVector3 local_50;
  cbtVector3 local_40;
  
  if (this->m_manifoldPtr != (cbtPersistentManifold *)0x0) {
    pcVar18 = body1;
    if (this->m_isSwapped != false) {
      pcVar18 = body0;
      body0 = body1;
    }
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    pcVar3 = body0->m_shape;
    pcVar4 = body0->m_worldTransform;
    pcVar5 = pcVar18->m_shape;
    local_90 = pcVar18->m_worldTransform;
    fVar6 = (pcVar4->m_origin).m_floats[0] - (local_90->m_origin).m_floats[0];
    fVar7 = (pcVar4->m_origin).m_floats[1] - (local_90->m_origin).m_floats[1];
    fVar8 = (pcVar4->m_origin).m_floats[2] - (local_90->m_origin).m_floats[2];
    fVar23 = (local_90->m_basis).m_el[1].m_floats[0];
    cVar1 = (pcVar4->m_basis).m_el[0].m_floats[1];
    fVar27 = (pcVar4->m_basis).m_el[1].m_floats[1];
    auVar28 = ZEXT416((uint)(local_90->m_basis).m_el[0].m_floats[0]);
    auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * fVar27)),auVar28,ZEXT416((uint)cVar1));
    cVar25 = (pcVar4->m_basis).m_el[2].m_floats[1];
    auVar29 = ZEXT416((uint)(local_90->m_basis).m_el[2].m_floats[0]);
    auVar30 = vfmadd231ss_fma(auVar30,auVar29,ZEXT416((uint)cVar25));
    fVar24 = (local_90->m_basis).m_el[1].m_floats[1];
    auVar31 = ZEXT416((uint)(local_90->m_basis).m_el[0].m_floats[1]);
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * fVar27)),auVar31,ZEXT416((uint)cVar1));
    auVar32 = ZEXT416((uint)(local_90->m_basis).m_el[2].m_floats[1]);
    auVar9 = vfmadd231ss_fma(auVar9,auVar32,ZEXT416((uint)cVar25));
    auVar30 = vinsertps_avx(auVar30,auVar9,0x10);
    fVar2 = (local_90->m_basis).m_el[1].m_floats[2];
    auVar33 = ZEXT416((uint)(local_90->m_basis).m_el[0].m_floats[2]);
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar27)),auVar33,ZEXT416((uint)cVar1));
    auVar34 = ZEXT416((uint)(local_90->m_basis).m_el[2].m_floats[2]);
    auVar9 = vfmadd231ss_fma(auVar9,auVar34,ZEXT416((uint)cVar25));
    local_b8.m_floats = (cbtScalar  [4])vinsertps_avx(auVar30,auVar9,0x28);
    auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar23)),ZEXT416((uint)fVar6),auVar28);
    auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)fVar8),auVar29);
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * fVar7)),ZEXT416((uint)fVar6),auVar31);
    auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar8),auVar32);
    auVar30 = vinsertps_avx(auVar30,auVar9,0x10);
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar7)),auVar33,ZEXT416((uint)fVar6));
    auVar9 = vfmadd231ss_fma(auVar9,auVar34,ZEXT416((uint)fVar8));
    local_78.m_floats = (cbtScalar  [4])vinsertps_avx(auVar30,auVar9,0x28);
    local_108 = (float)*(undefined8 *)&pcVar5[1].field_0xc;
    uStack_104 = (undefined4)((ulong)*(undefined8 *)&pcVar5[1].field_0xc >> 0x20);
    uStack_100 = 0;
    uVar26 = *(undefined8 *)((long)&pcVar5[1].m_userPointer + 4);
    local_d8 = (float)uVar26;
    uStack_d4 = (undefined4)((ulong)uVar26 >> 0x20);
    uStack_d0 = 0;
    local_c0 = resultOut;
    local_98 = this;
    (*pcVar5->_vptr_cbtCollisionShape[0xc])(pcVar5);
    fVar27 = (float)uVar26;
    (*pcVar5->_vptr_cbtCollisionShape[0xc])(pcVar5);
    fVar23 = fVar27;
    (*pcVar5->_vptr_cbtCollisionShape[0xc])(pcVar5);
    auVar30._4_4_ = uStack_104;
    auVar30._0_4_ = local_108;
    auVar30._8_8_ = uStack_100;
    auVar30 = vmovshdup_avx(auVar30);
    auVar30 = vinsertps_avx(ZEXT416((uint)(local_108 + (float)uVar26)),
                            ZEXT416((uint)(auVar30._0_4_ + fVar27)),0x10);
    auVar29._4_4_ = uStack_d4;
    auVar29._0_4_ = local_d8;
    auVar29._8_8_ = uStack_d0;
    auVar9 = vinsertps_avx(ZEXT416((uint)(local_d8 + fVar23)),auVar29,0x5c);
    local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar30,auVar9);
    fVar23 = *(float *)&pcVar3[1].field_0xc;
    local_d8 = fVar23;
    (*pcVar3->_vptr_cbtCollisionShape[0xc])(pcVar3);
    local_108 = fVar23;
    (*pcVar3->_vptr_cbtCollisionShape[0xc])(pcVar3);
    (*pcVar3->_vptr_cbtCollisionShape[0xc])(pcVar3);
    local_d8 = local_108 + local_d8;
    uVar26 = *(undefined8 *)&pcVar3[1].field_0xc;
    local_108 = (float)uVar26;
    uStack_104 = (undefined4)((ulong)uVar26 >> 0x20);
    uStack_100 = 0;
    (*pcVar3->_vptr_cbtCollisionShape[0xc])(pcVar3);
    fVar23 = (float)uVar26;
    (*pcVar3->_vptr_cbtCollisionShape[0xc])(pcVar3);
    (*pcVar3->_vptr_cbtCollisionShape[0xc])(pcVar3);
    auVar9._4_4_ = uStack_104;
    auVar9._0_4_ = local_108;
    auVar9._8_8_ = uStack_100;
    auVar30 = vmovshdup_avx(auVar9);
    fVar23 = auVar30._0_4_ + fVar23;
    local_a0 = 0;
    iVar15 = 0;
    do {
      auVar28._8_4_ = 0x7fffffff;
      auVar28._0_8_ = 0x7fffffff7fffffff;
      auVar28._12_4_ = 0x7fffffff;
      local_e8.m_floats[0] = 0.0;
      local_e8.m_floats[1] = 0.0;
      local_e8.m_floats[2] = 0.0;
      local_e8.m_floats[3] = 0.0;
      local_e8.m_floats[local_a0] = 1.0;
      auVar30 = vandps_avx(ZEXT416((uint)(local_b8.m_floats[local_a0] + -1.0)),auVar28);
      if ((1e-05 <= auVar30._0_4_) &&
         (auVar30 = vandps_avx(ZEXT416((uint)(local_b8.m_floats[local_a0] + 1.0)),auVar28),
         1e-05 <= auVar30._0_4_)) {
        auVar30 = vfmsub231ss_fma(ZEXT416((uint)(local_b8.m_floats[1] * local_e8.m_floats[2])),
                                  ZEXT416((uint)local_e8.m_floats[1]),
                                  ZEXT416((uint)local_b8.m_floats[2]));
        auVar9 = vfmsub231ss_fma(ZEXT416((uint)(local_b8.m_floats[2] * local_e8.m_floats[0])),
                                 ZEXT416((uint)local_b8.m_floats[0]),
                                 ZEXT416((uint)local_e8.m_floats[2]));
        auVar29 = vfmsub231ss_fma(ZEXT416((uint)(local_e8.m_floats[1] * local_b8.m_floats[0])),
                                  ZEXT416((uint)local_b8.m_floats[1]),
                                  ZEXT416((uint)local_e8.m_floats[0]));
        auVar28 = vfmsub231ss_fma(ZEXT416((uint)(local_b8.m_floats[1] * auVar29._0_4_)),auVar9,
                                  ZEXT416((uint)local_b8.m_floats[2]));
        auVar29 = vfmsub231ss_fma(ZEXT416((uint)(local_b8.m_floats[2] * auVar30._0_4_)),
                                  ZEXT416((uint)local_b8.m_floats[0]),auVar29);
        auVar9 = vfmsub231ss_fma(ZEXT416((uint)(local_b8.m_floats[0] * auVar9._0_4_)),
                                 ZEXT416((uint)local_b8.m_floats[1]),auVar30);
        fVar27 = auVar29._0_4_;
        auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar27)),auVar28,auVar28);
        auVar30 = vfmadd231ss_fma(auVar30,auVar9,auVar9);
        fVar24 = auVar30._0_4_;
        local_108 = auVar28._0_4_;
        local_110 = CONCAT44(local_110._4_4_,auVar9._0_4_);
        if (fVar24 < 0.0) {
          local_a8 = CONCAT44(local_a8._4_4_,fVar24);
          fVar24 = sqrtf(fVar24);
          auVar30 = ZEXT416((uint)local_a8);
        }
        else {
          auVar9 = vsqrtss_avx(auVar30,auVar30);
          fVar24 = auVar9._0_4_;
        }
        if (fVar24 <= 1e-05) {
          __assert_fail("r.length() > parallel_tol",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/ChCollisionAlgorithmsBullet.cpp"
                        ,0x178,
                        "virtual void chrono::collision::cbtCylshellBoxCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper *, const cbtCollisionObjectWrapper *, const cbtDispatcherInfo &, cbtManifoldResult *)"
                       );
        }
        if (auVar30._0_4_ < 0.0) {
          fVar24 = sqrtf(auVar30._0_4_);
        }
        else {
          auVar30 = vsqrtss_avx(auVar30,auVar30);
          fVar24 = auVar30._0_4_;
        }
        fVar24 = 1.0 / fVar24;
        local_108 = local_108 * fVar24;
        local_110 = CONCAT44(local_110._4_4_,(float)local_110 * fVar24);
        lVar22 = 0;
        do {
          fVar2 = local_d8 * *(float *)((long)&DAT_00a02bf8 + lVar22);
          auVar30 = vinsertps_avx(ZEXT416((uint)(fVar2 * local_108 + local_78.m_floats[0])),
                                  ZEXT416((uint)(fVar2 * fVar27 * fVar24 + local_78.m_floats[1])),
                                  0x10);
          local_f8.m_floats =
               (cbtScalar  [4])
               vinsertps_avx(auVar30,ZEXT416((uint)(fVar2 * (float)local_110 + local_78.m_floats[2])
                                            ),0x28);
          bVar11 = bt_utils::IntersectSegmentBox
                             (&local_40,&local_f8,&local_b8,fVar23,1e-05,&local_114,&local_118);
          if (bVar11) {
            auVar30 = vinsertps_avx(ZEXT416((uint)(local_b8.m_floats[0] * local_114 +
                                                  local_f8.m_floats[0])),
                                    ZEXT416((uint)(local_f8.m_floats[1] +
                                                  local_114 * local_b8.m_floats[1])),0x10);
            local_50.m_floats =
                 (cbtScalar  [4])
                 vinsertps_avx(auVar30,ZEXT416((uint)(local_114 * local_b8.m_floats[2] +
                                                     local_f8.m_floats[2])),0x28);
            auVar30 = vinsertps_avx(ZEXT416((uint)(local_f8.m_floats[0] +
                                                  local_b8.m_floats[0] * local_118)),
                                    ZEXT416((uint)(local_f8.m_floats[1] +
                                                  local_b8.m_floats[1] * local_118)),0x10);
            local_60.m_floats =
                 (cbtScalar  [4])
                 vinsertps_avx(auVar30,ZEXT416((uint)(local_b8.m_floats[2] * local_118 +
                                                     local_f8.m_floats[2])),0x28);
            fVar2 = (local_114 + local_118) * 0.5;
            auVar30 = vinsertps_avx(ZEXT416((uint)(local_f8.m_floats[0] +
                                                  local_b8.m_floats[0] * fVar2)),
                                    ZEXT416((uint)(local_f8.m_floats[1] +
                                                  local_b8.m_floats[1] * fVar2)),0x10);
            local_88.m_floats =
                 (cbtScalar  [4])
                 vinsertps_avx(auVar30,ZEXT416((uint)(local_f8.m_floats[2] +
                                                     local_b8.m_floats[2] * fVar2)),0x28);
            iVar12 = bt_utils::FindClosestBoxFace(&local_40,&local_88);
            pcVar4 = local_90;
            pcVar10 = local_c0;
            iVar13 = addContactPoint(&local_50,iVar12,&local_40,local_90,local_c0);
            iVar14 = addContactPoint(&local_60,iVar12,&local_40,pcVar4,pcVar10);
            iVar12 = addContactPoint(&local_88,iVar12,&local_40,pcVar4,pcVar10);
            iVar15 = iVar12 + iVar14 + iVar13 + iVar15;
          }
          lVar22 = lVar22 + 4;
        } while (lVar22 == 4);
      }
      local_a0 = local_a0 + 1;
    } while (local_a0 != 3);
    if (iVar15 < 1) {
      uVar21 = 0;
      do {
        local_e8.m_floats[0] = 0.0;
        local_e8.m_floats[1] = 0.0;
        local_e8.m_floats[2] = 0.0;
        local_e8.m_floats[3] = 0.0;
        local_e8.m_floats[uVar21] = 1.0;
        cVar1 = local_40.m_floats[uVar21];
        local_68 = uVar21 + 1;
        local_110 = (ulong)(((int)uVar21 + 2U) % 3);
        uVar17 = 0;
        if (local_68 != 3) {
          uVar17 = local_68 & 0xffffffff;
        }
        uVar16 = 0xffffffff;
        local_a0 = uVar21;
        do {
          local_a8 = uVar16;
          local_108 = (float)(int)uVar16;
          iVar15 = -3;
          do {
            local_f8.m_floats[uVar21] = 0.0;
            local_f8.m_floats[uVar17] = local_108 * local_40.m_floats[uVar17];
            local_f8.m_floats[local_110] = (float)(iVar15 + 2) * local_40.m_floats[local_110];
            bVar11 = bt_utils::IntersectSegmentCylinder
                               (&local_f8,&local_e8,cVar1,&local_78,&local_b8,fVar23,local_d8,1e-05,
                                &local_114,&local_118);
            pcVar4 = local_90;
            pcVar10 = local_c0;
            if (bVar11) {
              auVar30 = vinsertps_avx(ZEXT416((uint)(local_e8.m_floats[0] * local_114 +
                                                    local_f8.m_floats[0])),
                                      ZEXT416((uint)(local_f8.m_floats[1] +
                                                    local_114 * local_e8.m_floats[1])),0x10);
              local_50.m_floats =
                   (cbtScalar  [4])
                   vinsertps_avx(auVar30,ZEXT416((uint)(local_114 * local_e8.m_floats[2] +
                                                       local_f8.m_floats[2])),0x28);
              auVar30 = vinsertps_avx(ZEXT416((uint)(local_f8.m_floats[0] +
                                                    local_e8.m_floats[0] * local_118)),
                                      ZEXT416((uint)(local_f8.m_floats[1] +
                                                    local_e8.m_floats[1] * local_118)),0x10);
              local_60.m_floats =
                   (cbtScalar  [4])
                   vinsertps_avx(auVar30,ZEXT416((uint)(local_e8.m_floats[2] * local_118 +
                                                       local_f8.m_floats[2])),0x28);
              fVar27 = (local_114 + local_118) * 0.5;
              auVar30 = vinsertps_avx(ZEXT416((uint)(local_f8.m_floats[0] +
                                                    local_e8.m_floats[0] * fVar27)),
                                      ZEXT416((uint)(local_f8.m_floats[1] +
                                                    local_e8.m_floats[1] * fVar27)),0x10);
              local_88.m_floats =
                   (cbtScalar  [4])
                   vinsertps_avx(auVar30,ZEXT416((uint)(local_f8.m_floats[2] +
                                                       local_e8.m_floats[2] * fVar27)),0x28);
              cVar25 = local_88.m_floats[0];
              addContactPoint(&local_50,&local_78,&local_b8,cVar25,local_d8,local_90,local_c0);
              addContactPoint(&local_60,&local_78,&local_b8,cVar25,local_d8,pcVar4,pcVar10);
              uVar21 = local_a0;
              addContactPoint(&local_88,&local_78,&local_b8,cVar25,local_d8,pcVar4,pcVar10);
            }
            iVar15 = iVar15 + 2;
          } while (iVar15 < 0);
          uVar16 = (ulong)((int)local_a8 + 2);
        } while ((int)local_a8 < 0);
        uVar21 = local_68;
      } while (local_68 != 3);
      if (((local_98->m_ownManifold != false) && (local_98->m_manifoldPtr->m_cachedPoints != 0)) &&
         (this_00 = local_c0->m_manifoldPtr, this_00->m_cachedPoints != 0)) {
        pcVar20 = local_c0->m_body0Wrap->m_collisionObject;
        if (this_00->m_body0 == pcVar20) {
          pcVar19 = local_c0->m_body1Wrap->m_collisionObject;
        }
        else {
          pcVar19 = pcVar20;
          pcVar20 = local_c0->m_body1Wrap->m_collisionObject;
        }
        cbtPersistentManifold::refreshContactPoints
                  (this_00,&pcVar20->m_worldTransform,&pcVar19->m_worldTransform);
      }
    }
  }
  return;
}

Assistant:

void cbtCylshellBoxCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0,
                                                        const cbtCollisionObjectWrapper* body1,
                                                        const cbtDispatcherInfo& dispatchInfo,
                                                        cbtManifoldResult* resultOut) {
    (void)dispatchInfo;
    (void)resultOut;
    if (!m_manifoldPtr)
        return;

    const cbtCollisionObjectWrapper* cylObjWrap = m_isSwapped ? body1 : body0;
    const cbtCollisionObjectWrapper* boxObjWrap = m_isSwapped ? body0 : body1;

    resultOut->setPersistentManifold(m_manifoldPtr);

    const cbtCylindricalShellShape* cyl = (cbtCylindricalShellShape*)cylObjWrap->getCollisionShape();
    const cbtBoxShape* box = (cbtBoxShape*)boxObjWrap->getCollisionShape();

    // Express cylinder in the box frame
    const cbtTransform& abs_X_cyl = cylObjWrap->getWorldTransform();
    const cbtTransform& abs_X_box = boxObjWrap->getWorldTransform();
    cbtTransform box_X_cyl = abs_X_box.inverseTimes(abs_X_cyl);

    cbtVector3 a = box_X_cyl.getBasis().getColumn(1);  // cylinder axis (expressed in box frame)
    cbtVector3 c = box_X_cyl.getOrigin();              // cylinder center (expressed in box frame)

    // Box dimensions
    cbtVector3 hdims = box->getHalfExtentsWithMargin();

    // Cylinder dimensions
    cbtScalar radius = cyl->getRadius();    // cylinder radius
    cbtScalar hlen = cyl->getHalfLength();  // cylinder half-length

    const cbtScalar parallel_tol = cbtScalar(1e-5);  // tolearance for parallelism tests

    int num_contacts = 0;

    // - Loop over each direction of the box frame (i.e., each of the 3 face normals).
    // - For each direction, consider two segments on the cylindrical surface that are on a plane defined by the axis
    //   and the face normal. (Note that, in principle, we could only consider the segment "closest" to the box, but
    //   that is not trivial to define in all configurations). All segments are parameterized by t in [-H,H].
    // - For each segment, if the segment intersects the box, consider 3 candidate contact points: the 2 intersection
    //   points and their midpoint. A contact is added if the segment point is inside the box.
    //   Furthermore, the corresponding box point is located on the box face that is closest to the intersection
    //   midpoint candidate.
    for (int idir = 0; idir < 3; idir++) {
        // current box direction
        cbtVector3 ndir(0, 0, 0);
        ndir[idir] = 1;

        // If the axis is parallel to the current direction, no contact.
        if (std::abs(a[idir] - 1) < parallel_tol || std::abs(a[idir] + 1) < parallel_tol)
            continue;

        // Direction perpendicular to cylinder axis (in direction opposite to ndir)
        cbtVector3 v = ndir.cross(a);
        cbtVector3 r = v.cross(a);
        assert(r.length() > parallel_tol);
        r.normalize();

        // Consider segments in both "negative" and "positive" r direction
        cbtScalar dir[2] = {-1, 1};
        for (int jdir = 0; jdir < 2; jdir++) {
            // Calculate current segment center
            cbtVector3 cs = c + dir[jdir] * radius * r;
            // Check for intersection with box
            cbtScalar tMin, tMax;
            if (bt_utils::IntersectSegmentBox(hdims, cs, a, hlen, parallel_tol, tMin, tMax)) {
                // Consider the intersection points and their midpoint as candidates
                cbtVector3 pMin = cs + a * tMin;
                cbtVector3 pMax = cs + a * tMax;
                cbtVector3 pMid = cs + a * ((tMin + tMax) / 2);

                // Pick box face that is closest to midpoint
                int iface = bt_utils::FindClosestBoxFace(hdims, pMid);

                // Add a contact for any of the candidate points that is inside the box
                num_contacts += addContactPoint(pMin, iface, hdims, abs_X_box, resultOut);  // 1st segment end
                num_contacts += addContactPoint(pMax, iface, hdims, abs_X_box, resultOut);  // 2nd segment end
                num_contacts += addContactPoint(pMid, iface, hdims, abs_X_box, resultOut);  // intersection midpoint
            }
        }
    }

    // If a box face supports the cylinder, do not check box edges.
    if (num_contacts > 0)
        return;

    // - Loop over each direction of the box frame.
    // - For each direction, check intersection with the cylinder for all 4 edges parallel to that direction.
    // - If an edge intersects the cylinder, consider 3 candidate contact points: the 2 intersection points
    //   and their midpoint.
    for (int idir = 0; idir < 3; idir++) {
        // current box edge direction and halflength
        cbtVector3 eD(0, 0, 0);
        eD[idir] = 1;
        cbtScalar eH = hdims[idir];
        // The other two box directions
        int jdir = (idir + 1) % 3;
        int kdir = (idir + 2) % 3;
        for (int j = -1; j <= +1; j += 2) {
            for (int k = -1; k <= +1; k += 2) {
                cbtVector3 eC;
                eC[idir] = 0;
                eC[jdir] = j * hdims[jdir];
                eC[kdir] = k * hdims[kdir];
                // Check for edge intersection with cylinder
                cbtScalar tMin, tMax;
                if (bt_utils::IntersectSegmentCylinder(eC, eD, eH, c, a, hlen, radius, parallel_tol, tMin, tMax)) {
                    // Consider the intersection points and their midpoint as candidates
                    cbtVector3 pMin = eC + eD * tMin;
                    cbtVector3 pMax = eC + eD * tMax;
                    cbtVector3 pMid = eC + eD * ((tMin + tMax) / 2);

                    // Add a contact for any of the candidate points that is inside the cylinder
                    num_contacts += addContactPoint(pMin, c, a, hlen, radius, abs_X_box, resultOut);
                    num_contacts += addContactPoint(pMax, c, a, hlen, radius, abs_X_box, resultOut);
                    num_contacts += addContactPoint(pMid, c, a, hlen, radius, abs_X_box, resultOut);
                }
            }
        }
    }

    ////std::cout << num_contacts << std::endl;

    if (m_ownManifold && m_manifoldPtr->getNumContacts()) {
        resultOut->refreshContactPoints();
    }
}